

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O2

string * __thiscall
cmFileAPI::WriteJsonFile
          (string *__return_storage_ptr__,cmFileAPI *this,Value *value,string *prefix,
          _func_string_string_ptr *computeSuffix)

{
  StreamWriter *pSVar1;
  bool bVar2;
  string file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  string local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  ofstream ftmp;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::operator+(&local_2b0,&this->APIv1,"/tmp.json");
  std::ofstream::ofstream(&ftmp,local_2b0._M_dataplus._M_p,_S_out);
  pSVar1 = (this->JsonWriter)._M_t.
           super___uniq_ptr_impl<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>._M_t.
           super__Tuple_impl<0UL,_Json::StreamWriter_*,_std::default_delete<Json::StreamWriter>_>.
           super__Head_base<0UL,_Json::StreamWriter_*,_false>._M_head_impl;
  (*pSVar1->_vptr_StreamWriter[2])(pSVar1,value,&ftmp);
  std::operator<<(&ftmp.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
  std::ofstream::close();
  if (((&ftmp.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)ftmp.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]] & 5)
      != 0) {
    cmsys::SystemTools::RemoveFile(&local_2b0);
    goto LAB_004499aa;
  }
  std::operator+(&local_270,prefix,"-");
  (*computeSuffix)(&local_290,&local_2b0);
  std::operator+(&local_250,&local_270,&local_290);
  std::operator+(&file,&local_250,".json");
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&file);
  std::__cxx11::string::~string((string *)&file);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_270);
  std::operator+(&file,&this->APIv1,"/reply");
  cmsys::SystemTools::MakeDirectory(&file,(mode_t *)0x0);
  std::__cxx11::string::append((char *)&file);
  std::__cxx11::string::append((string *)&file);
  bVar2 = cmsys::SystemTools::FileExists(&file,true);
  if (bVar2) {
LAB_00449987:
    cmsys::SystemTools::RemoveFile(&local_2b0);
  }
  else {
    bVar2 = cmSystemTools::RenameFile(&local_2b0,&file);
    if (!bVar2) goto LAB_00449987;
  }
  std::__detail::
  _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            *)&this->ReplyFiles,__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&file);
LAB_004499aa:
  std::ofstream::~ofstream(&ftmp);
  std::__cxx11::string::~string((string *)&local_2b0);
  return __return_storage_ptr__;
}

Assistant:

std::string cmFileAPI::WriteJsonFile(
  Json::Value const& value, std::string const& prefix,
  std::string (*computeSuffix)(std::string const&))
{
  std::string fileName;

  // Write the json file with a temporary name.
  std::string const& tmpFile = this->APIv1 + "/tmp.json";
  cmsys::ofstream ftmp(tmpFile.c_str());
  this->JsonWriter->write(value, &ftmp);
  ftmp << "\n";
  ftmp.close();
  if (!ftmp) {
    cmSystemTools::RemoveFile(tmpFile);
    return fileName;
  }

  // Compute the final name for the file.
  fileName = prefix + "-" + computeSuffix(tmpFile) + ".json";

  // Create the destination.
  std::string file = this->APIv1 + "/reply";
  cmSystemTools::MakeDirectory(file);
  file += "/";
  file += fileName;

  // If the final name already exists then assume it has proper content.
  // Otherwise, atomically place the reply file at its final name
  if (cmSystemTools::FileExists(file, true) ||
      !cmSystemTools::RenameFile(tmpFile, file)) {
    cmSystemTools::RemoveFile(tmpFile);
  }

  // Record this among files we have just written.
  this->ReplyFiles.insert(fileName);

  return fileName;
}